

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CheckerDeclarationSyntax *pCVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000008;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000010;
  SyntaxList<slang::syntax::MemberSyntax> *in_stack_00000020;
  Token *in_stack_00000028;
  NamedBlockClauseSyntax **in_stack_00000030;
  BumpAllocator *in_stack_000000a8;
  Token *in_stack_000000b0;
  BumpAllocator *in_stack_ffffffffffffff58;
  AssertionItemPortListSyntax *in_stack_ffffffffffffff60;
  Token *args_4;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000010,in_stack_00000008);
  TVar2 = parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  TVar3 = parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  args_4 = (Token *)TVar3.info;
  if ((((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)((long)__fn + 0x70))->
      super_SyntaxListBase)._vptr_SyntaxListBase != (_func_int **)0x0) {
    deepClone<slang::syntax::AssertionItemPortListSyntax>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  deepClone<slang::syntax::MemberSyntax>
            ((SyntaxList<slang::syntax::MemberSyntax> *)in_stack_00000010,in_stack_00000008);
  parsing::Token::deepClone(in_stack_000000b0,in_stack_000000a8);
  if ((((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)((long)__fn + 0xa8))->
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr !=
      (pointer)0x0) {
    deepClone<slang::syntax::NamedBlockClauseSyntax>
              ((NamedBlockClauseSyntax *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CheckerDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::AssertionItemPortListSyntax*,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::syntax::NamedBlockClauseSyntax*>
                     (unaff_retaddr,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
                      (Token *)__child_stack,(Token *)TVar2.info,TVar2._0_8_,args_4,
                      in_stack_00000020,in_stack_00000028,in_stack_00000030);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CheckerDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CheckerDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.name.deepClone(alloc),
        node.portList ? deepClone(*node.portList, alloc) : nullptr,
        node.semi.deepClone(alloc),
        *deepClone(node.members, alloc),
        node.end.deepClone(alloc),
        node.endBlockName ? deepClone(*node.endBlockName, alloc) : nullptr
    );
}